

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O3

void __thiscall tinyusdz::usda::USDAReader::Impl::Impl(Impl *this,StreamReader *sr)

{
  _Rb_tree_header *p_Var1;
  
  (this->_stage)._root_nodes.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_stage)._root_nodes.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_stage)._root_nodes.super__Vector_base<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->_stage)._root_node_nameSet._M_t._M_impl.super__Rb_tree_header;
  (this->_stage)._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_stage)._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_stage)._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_stage)._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_stage)._root_node_nameSet._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_stage).name._M_dataplus._M_p = (pointer)&(this->_stage).name.field_2;
  (this->_stage).name._M_string_length = 0;
  (this->_stage).name.field_2._M_local_buf[0] = '\0';
  (this->_stage).default_root_node = -1;
  LayerMetas::LayerMetas(&(this->_stage).stage_metas);
  (this->_stage)._err._M_dataplus._M_p = (pointer)&(this->_stage)._err.field_2;
  (this->_stage)._err._M_string_length = 0;
  (this->_stage)._err.field_2._M_local_buf[0] = '\0';
  (this->_stage)._warn._M_dataplus._M_p = (pointer)&(this->_stage)._warn.field_2;
  (this->_stage)._warn._M_string_length = 0;
  (this->_stage)._warn.field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->_stage)._prim_path_cache._M_t._M_impl.super__Rb_tree_header;
  (this->_stage)._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_stage)._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_stage)._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_stage)._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_stage)._prim_path_cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->_stage)._prim_id_cache._M_t._M_impl.super__Rb_tree_header;
  (this->_stage)._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_stage)._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_stage)._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_stage)._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_stage)._prim_id_cache._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_stage)._dirty = true;
  (this->_stage)._prim_id_dirty = true;
  (this->_stage)._prim_id_allocator.freeList_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->_stage)._prim_id_allocator.freeList_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->_stage)._prim_id_allocator.freeList_.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->_stage)._prim_id_allocator.counter_ = 1;
  (this->_stage)._prim_id_allocator.dirty_ = true;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->parse_stack).c.
  super__Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ::std::
  _Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
  ::_M_initialize_map((_Deque_base<tinyusdz::usda::USDAReader::ParseState,_std::allocator<tinyusdz::usda::USDAReader::ParseState>_>
                       *)&this->parse_stack,0);
  (this->_base_dir)._M_dataplus._M_p = (pointer)&(this->_base_dir).field_2;
  (this->_base_dir)._M_string_length = 0;
  (this->_base_dir).field_2._M_local_buf[0] = '\0';
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->_path_stack).c.
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  ::std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map((_Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&this->_path_stack,0);
  (this->_err)._M_dataplus._M_p = (pointer)&(this->_err).field_2;
  (this->_err)._M_string_length = 0;
  (this->_err).field_2._M_local_buf[0] = '\0';
  (this->_warn)._M_dataplus._M_p = (pointer)&(this->_warn).field_2;
  (this->_warn)._M_string_length = 0;
  (this->_warn).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->_reference_cache)._M_t._M_impl.super__Rb_tree_header;
  (this->_reference_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_reference_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->_reference_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->_reference_cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header;
  (this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_reference_cache)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_toplevel_prims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_toplevel_prims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_toplevel_prims).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_prim_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_prim_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_prim_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header;
  (this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->_primspec_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_primspec_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_primspec_nodes).
  super__Vector_base<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode,_std::allocator<tinyusdz::usda::(anonymous_namespace)::PrimSpecNode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_toplevel_primspecs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_toplevel_primspecs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_primpath_to_prim_idx_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_toplevel_primspecs).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->_primpath_to_primspec_idx_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->_primspec_invalidated = false;
  (this->_defaultPrim)._M_dataplus._M_p = (pointer)&(this->_defaultPrim).field_2;
  (this->_defaultPrim)._M_string_length = 0;
  (this->_defaultPrim).field_2._M_local_buf[0] = '\0';
  (this->_config).allow_unknown_prims = true;
  (this->_config).allow_unknown_shader = true;
  (this->_config).allow_unknown_apiSchema = true;
  (this->_config).strict_allowedToken_check = false;
  ascii::AsciiParser::AsciiParser(&this->_parser);
  ascii::AsciiParser::SetStream(&this->_parser,sr);
  return;
}

Assistant:

Impl(StreamReader *sr) { _parser.SetStream(sr); }